

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O2

void Pdr_ManCollectValues(Pdr_Man_t *p,int k,Vec_Int_t *vObjIds,Vec_Int_t *vValues)

{
  Aig_Man_t *pAVar1;
  Vec_Ptr_t *p_00;
  int i;
  uint uVar2;
  sat_solver *psVar3;
  Aig_Obj_t *pObj;
  int i_00;
  
  vValues->nSize = 0;
  psVar3 = Pdr_ManSolver(p,k);
  i_00 = 0;
  while( true ) {
    if (vObjIds->nSize <= i_00) {
      return;
    }
    pAVar1 = p->pAig;
    i = Vec_IntEntry(vObjIds,i_00);
    p_00 = pAVar1->vObjs;
    if (p_00 == (Vec_Ptr_t *)0x0) {
      pObj = (Aig_Obj_t *)0x0;
    }
    else {
      pObj = (Aig_Obj_t *)Vec_PtrEntry(p_00,i);
    }
    uVar2 = Pdr_ObjSatVar(p,k,3,pObj);
    if ((int)uVar2 < 0) break;
    if (psVar3->size <= (int)uVar2) {
      __assert_fail("v >= 0 && v < s->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                    ,0xcd,"int sat_solver_var_value(sat_solver *, int)");
    }
    Vec_IntPush(vValues,(uint)(psVar3->model[uVar2] == 1));
    i_00 = i_00 + 1;
  }
  __assert_fail("iVar >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrSat.c"
                ,0xf1,"void Pdr_ManCollectValues(Pdr_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Pdr_ManCollectValues( Pdr_Man_t * p, int k, Vec_Int_t * vObjIds, Vec_Int_t * vValues )
{
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int iVar, i;
    Vec_IntClear( vValues );
    pSat = Pdr_ManSolver(p, k);
    Aig_ManForEachObjVec( vObjIds, p->pAig, pObj, i )
    {
        iVar = Pdr_ObjSatVar( p, k, 3, pObj ); assert( iVar >= 0 );
        Vec_IntPush( vValues, sat_solver_var_value(pSat, iVar) );
    }
}